

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O1

void cf2_builder_cubeTo(CF2_OutlineCallbacks callbacks,CF2_CallbackParams params)

{
  short sVar1;
  PS_Builder *builder;
  FT_GlyphLoader loader;
  FT_Outline *pFVar2;
  long lVar3;
  FT_Vector *pFVar4;
  char *pcVar5;
  int iVar6;
  
  builder = (PS_Builder *)callbacks[1].moveTo;
  if ((builder->path_begun != '\0') ||
     (iVar6 = ps_builder_start_point(builder,(params->pt0).x,(params->pt0).y), iVar6 == 0)) {
    loader = builder->loader;
    iVar6 = 0;
    if (loader->max_points <
        (int)(loader->current).outline.n_points + (int)(loader->base).outline.n_points + 3U) {
      iVar6 = FT_GlyphLoader_CheckPoints(loader,3,0);
    }
    if (iVar6 == 0) {
      pFVar2 = builder->current;
      if (builder->load_points != '\0') {
        lVar3 = (params->pt1).y;
        sVar1 = pFVar2->n_points;
        pFVar4 = pFVar2->points;
        pcVar5 = pFVar2->tags;
        pFVar4[sVar1].x = (params->pt1).x >> 10;
        pFVar4[sVar1].y = lVar3 >> 10;
        pcVar5[sVar1] = '\x02';
      }
      pFVar2->n_points = pFVar2->n_points + 1;
      pFVar2 = builder->current;
      if (builder->load_points != '\0') {
        lVar3 = (params->pt2).y;
        sVar1 = pFVar2->n_points;
        pFVar4 = pFVar2->points;
        pcVar5 = pFVar2->tags;
        pFVar4[sVar1].x = (params->pt2).x >> 10;
        pFVar4[sVar1].y = lVar3 >> 10;
        pcVar5[sVar1] = '\x02';
      }
      pFVar2->n_points = pFVar2->n_points + 1;
      pFVar2 = builder->current;
      if (builder->load_points != '\0') {
        lVar3 = (params->pt3).y;
        sVar1 = pFVar2->n_points;
        pFVar4 = pFVar2->points;
        pcVar5 = pFVar2->tags;
        pFVar4[sVar1].x = (params->pt3).x >> 10;
        pFVar4[sVar1].y = lVar3 >> 10;
        pcVar5[sVar1] = '\x01';
      }
      pFVar2->n_points = pFVar2->n_points + 1;
      return;
    }
  }
  if (*callbacks->error == 0) {
    *callbacks->error = iVar6;
  }
  return;
}

Assistant:

static void
  cf2_builder_cubeTo( CF2_OutlineCallbacks      callbacks,
                      const CF2_CallbackParams  params )
  {
    FT_Error  error;

    /* downcast the object pointer */
    CF2_Outline  outline = (CF2_Outline)callbacks;
    PS_Builder*  builder;


    FT_ASSERT( outline && outline->decoder );
    FT_ASSERT( params->op == CF2_PathOpCubeTo );

    builder = &outline->decoder->builder;

    if ( !builder->path_begun )
    {
      /* record the move before the line; also check points and set */
      /* `path_begun'                                               */
      error = ps_builder_start_point( builder,
                                      params->pt0.x,
                                      params->pt0.y );
      if ( error )
      {
        if ( !*callbacks->error )
          *callbacks->error =  error;
        return;
      }
    }

    /* prepare room for 3 points: 2 off-curve, 1 on-curve */
    error = ps_builder_check_points( builder, 3 );
    if ( error )
    {
      if ( !*callbacks->error )
        *callbacks->error =  error;
      return;
    }

    ps_builder_add_point( builder,
                          params->pt1.x,
                          params->pt1.y, 0 );
    ps_builder_add_point( builder,
                          params->pt2.x,
                          params->pt2.y, 0 );
    ps_builder_add_point( builder,
                          params->pt3.x,
                          params->pt3.y, 1 );
  }